

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<const_kj::FsNode> __thiscall
kj::anon_unknown_8::DiskReadableDirectory::cloneFsNode(DiskReadableDirectory *this)

{
  AutoCloseFd in_RAX;
  AutoCloseFd AVar1;
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode> OVar2;
  AutoCloseFd local_18;
  
  local_18 = in_RAX;
  DiskHandle::clone((DiskHandle *)&local_18,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  AVar1 = (AutoCloseFd)operator_new(0x10);
  *(undefined ***)AVar1 = &PTR_getFd_00280c50;
  *(int *)((long)AVar1 + 8) = local_18.fd;
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar1 + 0xc));
  local_18.fd = -1;
  *(undefined ***)AVar1 = &PTR_getFd_00280480;
  (this->super_ReadableDirectory).super_FsNode._vptr_FsNode =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableDirectory>::instance;
  (this->super_DiskHandle).fd = AVar1;
  AutoCloseFd::~AutoCloseFd(&local_18);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Array<Entry> listEntries() const override { return DiskHandle::listEntries(); }